

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day18.cpp
# Opt level: O3

void day18(input_t input)

{
  array<__attribute__((__vector_size__(4_*_sizeof(long_long))))_long_long,_100UL> *paVar1;
  undefined8 *puVar2;
  undefined2 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  longlong alVar6 [4];
  undefined1 auVar7 [32];
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined1 auVar13 [32];
  pointer pMVar14;
  pointer pMVar15;
  _Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_> *this;
  pointer pMVar16;
  pointer pMVar17;
  int iVar18;
  size_t i;
  ulong uVar19;
  uint32_t tree;
  int iVar20;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer extraout_RDX_01;
  undefined1 (*pauVar21) [32];
  char *__s;
  Map *__cur_1;
  long lVar22;
  pointer pMVar23;
  int iVar24;
  pointer pMVar25;
  value_type_conflict3 *__x;
  _Link_type __x_00;
  pointer pMVar26;
  set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_> *this_00;
  uint32_t yard;
  int iVar27;
  long lVar28;
  pointer __src;
  Map *__cur;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  pair<std::_Rb_tree_const_iterator<unsigned_short>,_bool> pVar38;
  set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_> seen;
  Map A;
  undefined1 auStack_1a40 [16];
  pointer local_1a30;
  pointer local_1a28;
  pointer local_1a20;
  _Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_> *local_1a18;
  set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_> local_1a10;
  value_type_conflict3 local_19e0;
  undefined1 auStack_19de [30];
  undefined1 local_19c0 [32];
  undefined1 local_d60 [64];
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined1 auStack_d00 [3200];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  pMVar23 = DAT_00185978;
  pMVar25 = (pointer)input.len;
  pMVar17 = (pointer)input.s;
  local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a10._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a10._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar16 = (anonymous_namespace)::History::V;
  pMVar26 = pMVar17;
  local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((ulong)(((long)DAT_00185980 - (long)(anonymous_namespace)::History::V >> 6) *
             -0x505050505050505) < 1000) {
    pMVar25 = (pointer)0x20;
    local_1a20 = (anonymous_namespace)::History::V;
    pMVar15 = (pointer)operator_new(0x31ce00,0x20);
    pMVar14 = DAT_00185978;
    local_1a28 = pMVar15;
    pMVar16 = extraout_RDX;
    pMVar26 = (anonymous_namespace)::History::V;
    for (__src = (anonymous_namespace)::History::V; local_1a30 = pMVar26, __src != pMVar14;
        __src = __src + 1) {
      pMVar25 = __src;
      memcpy(pMVar15,__src,0xcc0);
      pMVar15 = pMVar15 + 1;
      pMVar16 = extraout_RDX_00;
      pMVar26 = local_1a30;
    }
    lVar22 = (long)pMVar23 - (long)local_1a20;
    if (pMVar26 != (pointer)0x0) {
      pMVar25 = (pointer)((long)DAT_00185980 - (long)pMVar26);
      operator_delete(pMVar26,(ulong)pMVar25,0x20);
      pMVar16 = extraout_RDX_01;
    }
    (anonymous_namespace)::History::V = local_1a28;
    DAT_00185978 = (pointer)(lVar22 + (long)local_1a28);
    DAT_00185980 = local_1a28 + 1000;
  }
  pMVar15 = DAT_00185980;
  pMVar23 = DAT_00185978;
  auVar30 = _DAT_001156e0;
  if (DAT_00185978 == DAT_00185980) {
    this = (_Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_> *)
           std::vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>::
           _M_check_len((vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                         *)pMVar26,(size_type)pMVar25,(char *)pMVar16);
    pMVar26 = (anonymous_namespace)::History::V;
    local_1a28 = DAT_00185978;
    pMVar16 = std::
              _Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
              ::_M_allocate(this,(size_t)pMVar25);
    auVar30 = _DAT_001156e0;
    lVar22 = (long)pMVar15 - (long)pMVar26;
    puVar2 = (undefined8 *)((long)pMVar16 + lVar22);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    puVar2 = (undefined8 *)((long)pMVar16 + lVar22 + 0xca0);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    auVar29._8_8_ = 0x1111111111111111;
    auVar29._0_8_ = 0x1111111111111111;
    auVar29._16_8_ = 0x1111111111111111;
    auVar29._24_8_ = 0x1111111111111111;
    pauVar21 = (undefined1 (*) [32])((long)pMVar16 + lVar22 + 0x40);
    uVar19 = 0xfffffffffffffffe;
    do {
      paVar1 = &pMVar17->V;
      auVar32 = vpand_avx2(auVar29,*(undefined1 (*) [32])pMVar17->pad0);
      pMVar17 = (pointer)((long)(pMVar17->V)._M_elems[0] + 0x13);
      uVar19 = uVar19 + 2;
      auVar5 = vpand_avx2((undefined1  [32])paVar1->_M_elems[0],auVar30);
      pauVar21[-1] = auVar32;
      *pauVar21 = auVar5;
      pauVar21 = pauVar21 + 2;
      local_1a30 = pMVar16;
      pMVar25 = pMVar26;
    } while (uVar19 < 0x62);
    for (; local_1a20 = pMVar26, local_1a18 = this, pMVar25 != pMVar15; pMVar25 = pMVar25 + 1) {
      memcpy(pMVar16,pMVar25,0xcc0);
      pMVar16 = pMVar16 + 1;
      this = local_1a18;
      pMVar26 = local_1a20;
    }
    pMVar16 = pMVar16 + 1;
    if (local_1a28 != pMVar15) {
      do {
        memcpy(pMVar16,pMVar23,0xcc0);
        pMVar23 = pMVar23 + 1;
        pMVar16 = pMVar16 + 1;
      } while (pMVar23 != local_1a28);
    }
    if (pMVar26 != (pointer)0x0) {
      operator_delete(pMVar26,(long)DAT_00185980 - (long)pMVar26,0x20);
    }
    (anonymous_namespace)::History::V = local_1a30;
    DAT_00185980 = local_1a30 + (long)this;
    DAT_00185978 = pMVar16;
  }
  else {
    uVar19 = 0xfffffffffffffffe;
    DAT_00185978->pad0[0] = 0;
    DAT_00185978->pad0[1] = 0;
    DAT_00185978->pad0[2] = 0;
    DAT_00185978->pad0[3] = 0;
    DAT_00185978->pad1[0] = 0;
    DAT_00185978->pad1[1] = 0;
    DAT_00185978->pad1[2] = 0;
    DAT_00185978->pad1[3] = 0;
    auVar32._8_8_ = 0x1111111111111111;
    auVar32._0_8_ = 0x1111111111111111;
    auVar32._16_8_ = 0x1111111111111111;
    auVar32._24_8_ = 0x1111111111111111;
    pMVar16 = DAT_00185978;
    do {
      pMVar25 = (pointer)((pMVar16->V)._M_elems + 1);
      paVar1 = &pMVar17->V;
      alVar6 = (longlong  [4])vpand_avx2(auVar32,*(undefined1 (*) [32])pMVar17->pad0);
      pMVar17 = (pointer)((long)(pMVar17->V)._M_elems[0] + 0x13);
      uVar19 = uVar19 + 2;
      auVar29 = vpand_avx2((undefined1  [32])paVar1->_M_elems[0],auVar30);
      (pMVar16->V)._M_elems[0] = alVar6;
      *(undefined1 (*) [32])pMVar25->pad0 = auVar29;
      pMVar16 = pMVar25;
    } while (uVar19 < 0x62);
    DAT_00185978 = DAT_00185978 + 1;
  }
  __x = &local_19e0;
  local_19e0 = 0;
  this_00 = &local_1a10;
  pVar38 = std::set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>
           ::insert(this_00,__x);
  __s = pVar38._8_8_;
  do {
    pMVar16 = DAT_00185978;
    lVar22 = -0xca1;
    local_d60 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    do {
      auVar30 = vpaddb_avx2(*(undefined1 (*) [32])((long)DAT_00185978->pad0 + lVar22),
                            *(undefined1 (*) [32])((long)DAT_00185978->pad0 + lVar22 + 1));
      auVar30 = vpaddb_avx2(auVar30,*(undefined1 (*) [32])((long)DAT_00185978->pad0 + lVar22 + 2));
      *(undefined1 (*) [32])(local_d60 + lVar22 + 0x21) = auVar30;
      lVar22 = lVar22 + 0x20;
    } while (lVar22 != -0x21);
    auVar5._2_30_ = auStack_19de;
    auVar5._0_2_ = local_19e0;
    auVar34 = ZEXT1664((undefined1  [16])0x0);
    uVar19 = 0xfffffffffffffffe;
    lVar22 = 0x60;
    auVar37 = ZEXT1664((undefined1  [16])0x0);
    auVar29 = local_19c0;
    auVar30 = auVar5;
    do {
      auVar32 = *(undefined1 (*) [32])
                 ((long)&local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + lVar22)
      ;
      auVar4 = vpaddb_avx2(auVar29,*(undefined1 (*) [32])(auStack_19de + lVar22 + -2));
      uVar19 = uVar19 + 2;
      auVar5 = vpaddb_avx2(auVar32,auVar5);
      auVar7 = vpsubb_avx2(auVar5,*(undefined1 (*) [32])((long)DAT_00185978 + lVar22 + -0xd00));
      auVar29 = vpsubb_avx2(auVar4,auVar37._0_32_);
      auVar37 = ZEXT3264(*(undefined1 (*) [32])((long)&local_1a20 + lVar22));
      auVar5 = vpsubb_avx2(auVar5,auVar34._0_32_);
      auVar34 = ZEXT3264(auVar30);
      *(undefined1 (*) [32])(auStack_1a40 + lVar22) = auVar7;
      auVar30 = vpsubb_avx2(auVar4,*(undefined1 (*) [32])((long)DAT_00185978 + lVar22 + -0xce0));
      *(undefined1 (*) [32])((long)&local_1a20 + lVar22) = auVar30;
      lVar22 = lVar22 + 0x40;
      auVar30 = auVar32;
    } while (uVar19 < 0x62);
    lVar22 = 0;
    uVar19 = 0;
    local_d20 = 0;
    uStack_d18 = 0;
    uStack_d10 = 0;
    uStack_d08 = 0;
    local_80 = 0;
    uStack_78 = 0;
    uStack_70 = 0;
    uStack_68 = 0;
    do {
      auVar35[8] = 0xf;
      auVar35._0_8_ = 0xf0f0f0f0f0f0f0f;
      auVar35[9] = 0xf;
      auVar35[10] = 0xf;
      auVar35[0xb] = 0xf;
      auVar35[0xc] = 0xf;
      auVar35[0xd] = 0xf;
      auVar35[0xe] = 0xf;
      auVar35[0xf] = 0xf;
      auVar35[0x10] = 0xf;
      auVar35[0x11] = 0xf;
      auVar35[0x12] = 0xf;
      auVar35[0x13] = 0xf;
      auVar35[0x14] = 0xf;
      auVar35[0x15] = 0xf;
      auVar35[0x16] = 0xf;
      auVar35[0x17] = 0xf;
      auVar35[0x18] = 0xf;
      auVar35[0x19] = 0xf;
      auVar35[0x1a] = 0xf;
      auVar35[0x1b] = 0xf;
      auVar35[0x1c] = 0xf;
      auVar35[0x1d] = 0xf;
      auVar35[0x1e] = 0xf;
      auVar35[0x1f] = 0xf;
      auVar36[8] = 2;
      auVar36._0_8_ = 0x202020202020202;
      auVar36[9] = 2;
      auVar36[10] = 2;
      auVar36[0xb] = 2;
      auVar36[0xc] = 2;
      auVar36[0xd] = 2;
      auVar36[0xe] = 2;
      auVar36[0xf] = 2;
      auVar36[0x10] = 2;
      auVar36[0x11] = 2;
      auVar36[0x12] = 2;
      auVar36[0x13] = 2;
      auVar36[0x14] = 2;
      auVar36[0x15] = 2;
      auVar36[0x16] = 2;
      auVar36[0x17] = 2;
      auVar36[0x18] = 2;
      auVar36[0x19] = 2;
      auVar36[0x1a] = 2;
      auVar36[0x1b] = 2;
      auVar36[0x1c] = 2;
      auVar36[0x1d] = 2;
      auVar36[0x1e] = 2;
      auVar36[0x1f] = 2;
      auVar30 = *(undefined1 (*) [32])((long)DAT_00185978 + lVar22 + -0xca0);
      auVar32 = vpsrlq_avx2(*(undefined1 (*) [32])(auStack_19de + lVar22 + -2),4);
      auVar29 = vpand_avx2(*(undefined1 (*) [32])(auStack_19de + lVar22 + -2),auVar35);
      auVar32 = vpand_avx2(auVar32,auVar35);
      uVar10 = vptestnmb_avx512vl(auVar29,auVar29);
      uVar11 = vptestnmb_avx512vl(auVar32,auVar32);
      uVar9 = vpcmpgtb_avx512vl(auVar32,auVar36);
      auVar33[8] = 0x10;
      auVar33._0_8_ = 0x1010101010101010;
      auVar33[9] = 0x10;
      auVar33[10] = 0x10;
      auVar33[0xb] = 0x10;
      auVar33[0xc] = 0x10;
      auVar33[0xd] = 0x10;
      auVar33[0xe] = 0x10;
      auVar33[0xf] = 0x10;
      auVar33[0x10] = 0x10;
      auVar33[0x11] = 0x10;
      auVar33[0x12] = 0x10;
      auVar33[0x13] = 0x10;
      auVar33[0x14] = 0x10;
      auVar33[0x15] = 0x10;
      auVar33[0x16] = 0x10;
      auVar33[0x17] = 0x10;
      auVar33[0x18] = 0x10;
      auVar33[0x19] = 0x10;
      auVar33[0x1a] = 0x10;
      auVar33[0x1b] = 0x10;
      auVar33[0x1c] = 0x10;
      auVar33[0x1d] = 0x10;
      auVar33[0x1e] = 0x10;
      auVar33[0x1f] = 0x10;
      uVar12 = vptestnmb_avx512vl(auVar30,auVar30);
      uVar8 = vpcmpeqb_avx512vl(auVar30,auVar33);
      auVar32 = vpmovm2b_avx512vl(uVar9 & uVar12);
      uVar9 = vpcmpgtb_avx512vl(auVar29,auVar36);
      auVar29 = vpmovm2b_avx512vl(uVar8 & uVar9);
      auVar4._8_8_ = 0x1111111111111111;
      auVar4._0_8_ = 0x1111111111111111;
      auVar4._16_8_ = 0x1111111111111111;
      auVar4._24_8_ = 0x1111111111111111;
      auVar29 = vpandq_avx512vl(auVar29,auVar4);
      auVar31[8] = 1;
      auVar31._0_8_ = 0x101010101010101;
      auVar31[9] = 1;
      auVar31[10] = 1;
      auVar31[0xb] = 1;
      auVar31[0xc] = 1;
      auVar31[0xd] = 1;
      auVar31[0xe] = 1;
      auVar31[0xf] = 1;
      auVar31[0x10] = 1;
      auVar31[0x11] = 1;
      auVar31[0x12] = 1;
      auVar31[0x13] = 1;
      auVar31[0x14] = 1;
      auVar31[0x15] = 1;
      auVar31[0x16] = 1;
      auVar31[0x17] = 1;
      auVar31[0x18] = 1;
      auVar31[0x19] = 1;
      auVar31[0x1a] = 1;
      auVar31[0x1b] = 1;
      auVar31[0x1c] = 1;
      auVar31[0x1d] = 1;
      auVar31[0x1e] = 1;
      auVar31[0x1f] = 1;
      auVar7._8_8_ = 0x1010101010101010;
      auVar7._0_8_ = 0x1010101010101010;
      auVar7._16_8_ = 0x1010101010101010;
      auVar7._24_8_ = 0x1010101010101010;
      auVar32 = vpternlogq_avx512vl(auVar29,auVar32,auVar7,0x78);
      uVar8 = vpcmpeqb_avx512vl(auVar30,auVar31);
      auVar29 = vpmovm2b_avx512vl(((uint)uVar11 | (uint)uVar10) & uVar8);
      auVar13._8_8_ = 0x101010101010101;
      auVar13._0_8_ = 0x101010101010101;
      auVar13._16_8_ = 0x101010101010101;
      auVar13._24_8_ = 0x101010101010101;
      auVar29 = vpandq_avx512vl(auVar29,auVar13);
      auVar30 = vpternlogq_avx512vl(auVar29,auVar30,auVar32,0x96);
      if ((uVar19 & 1) != 0) {
        auVar30 = vpand_avx2(auVar30,_DAT_001156e0);
      }
      *(undefined1 (*) [32])(auStack_d00 + lVar22) = auVar30;
      uVar19 = uVar19 + 1;
      lVar22 = lVar22 + 0x20;
    } while (uVar19 != 100);
    if (DAT_00185978 == DAT_00185980) {
      pMVar17 = (pointer)std::
                         vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                         ::_M_check_len((vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                                         *)this_00,(size_type)__x,__s);
      pMVar23 = DAT_00185978;
      pMVar26 = (anonymous_namespace)::History::V;
      pMVar25 = std::
                _Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                ::_M_allocate((_Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                               *)pMVar17,(size_t)__x);
      local_1a20 = pMVar17;
      memcpy((void *)((long)pMVar25 + ((long)pMVar16 - (long)pMVar26)),&local_d20,0xcc0);
      local_1a28 = pMVar25;
      local_1a30 = pMVar26;
      for (; pMVar16 != pMVar26; pMVar26 = pMVar26 + 1) {
        memcpy(pMVar25,pMVar26,0xcc0);
        pMVar25 = pMVar25 + 1;
      }
      for (; pMVar25 = pMVar25 + 1, pMVar23 != pMVar16; pMVar16 = pMVar16 + 1) {
        memcpy(pMVar25,pMVar16,0xcc0);
      }
      if (local_1a30 != (pointer)0x0) {
        operator_delete(local_1a30,(long)DAT_00185980 - (long)local_1a30,0x20);
      }
      (anonymous_namespace)::History::V = local_1a28;
      DAT_00185980 = local_1a28 + (long)local_1a20;
      DAT_00185978 = pMVar25;
    }
    else {
      memcpy(DAT_00185978,&local_d20,0xcc0);
      DAT_00185978 = pMVar16 + 1;
    }
    this_00 = &local_1a10;
    local_19e0 = (value_type_conflict3)local_1a10._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __x = &local_19e0;
    pVar38 = std::
             set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>::
             insert(this_00,__x);
    __s = pVar38._8_8_;
  } while (((undefined1  [16])pVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
  uVar3 = (undefined2)pVar38.first._M_node._M_node[1]._M_color;
  lVar22 = -0xc80;
  iVar24 = 0;
  iVar18 = 0;
  do {
    auVar30 = *(undefined1 (*) [32])((long)(anonymous_namespace)::History::V[10].pad1 + lVar22);
    auVar29 = vpsllq_avx2(auVar30,3);
    auVar30 = vpsllq_avx2(auVar30,7);
    iVar24 = iVar24 + POPCOUNT((uint)(SUB321(auVar29 >> 7,0) & 1) |
                               (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1 |
                               (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                               (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                               (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                               (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                               (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                               (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                               (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                               (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                               (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                               (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                               (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                               (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                               (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                               (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                               (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                               (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                               (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                               (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                               (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                               (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                               (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                               (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                               (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                               (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                               (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                               (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                               (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                               (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                               (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f);
    iVar18 = iVar18 + POPCOUNT((uint)(SUB321(auVar30 >> 7,0) & 1) |
                               (uint)(SUB321(auVar30 >> 0xf,0) & 1) << 1 |
                               (uint)(SUB321(auVar30 >> 0x17,0) & 1) << 2 |
                               (uint)(SUB321(auVar30 >> 0x1f,0) & 1) << 3 |
                               (uint)(SUB321(auVar30 >> 0x27,0) & 1) << 4 |
                               (uint)(SUB321(auVar30 >> 0x2f,0) & 1) << 5 |
                               (uint)(SUB321(auVar30 >> 0x37,0) & 1) << 6 |
                               (uint)(SUB321(auVar30 >> 0x3f,0) & 1) << 7 |
                               (uint)(SUB321(auVar30 >> 0x47,0) & 1) << 8 |
                               (uint)(SUB321(auVar30 >> 0x4f,0) & 1) << 9 |
                               (uint)(SUB321(auVar30 >> 0x57,0) & 1) << 10 |
                               (uint)(SUB321(auVar30 >> 0x5f,0) & 1) << 0xb |
                               (uint)(SUB321(auVar30 >> 0x67,0) & 1) << 0xc |
                               (uint)(SUB321(auVar30 >> 0x6f,0) & 1) << 0xd |
                               (uint)(SUB321(auVar30 >> 0x77,0) & 1) << 0xe |
                               (uint)SUB321(auVar30 >> 0x7f,0) << 0xf |
                               (uint)(SUB321(auVar30 >> 0x87,0) & 1) << 0x10 |
                               (uint)(SUB321(auVar30 >> 0x8f,0) & 1) << 0x11 |
                               (uint)(SUB321(auVar30 >> 0x97,0) & 1) << 0x12 |
                               (uint)(SUB321(auVar30 >> 0x9f,0) & 1) << 0x13 |
                               (uint)(SUB321(auVar30 >> 0xa7,0) & 1) << 0x14 |
                               (uint)(SUB321(auVar30 >> 0xaf,0) & 1) << 0x15 |
                               (uint)(SUB321(auVar30 >> 0xb7,0) & 1) << 0x16 |
                               (uint)SUB321(auVar30 >> 0xbf,0) << 0x17 |
                               (uint)(SUB321(auVar30 >> 199,0) & 1) << 0x18 |
                               (uint)(SUB321(auVar30 >> 0xcf,0) & 1) << 0x19 |
                               (uint)(SUB321(auVar30 >> 0xd7,0) & 1) << 0x1a |
                               (uint)(SUB321(auVar30 >> 0xdf,0) & 1) << 0x1b |
                               (uint)(SUB321(auVar30 >> 0xe7,0) & 1) << 0x1c |
                               (uint)(SUB321(auVar30 >> 0xef,0) & 1) << 0x1d |
                               (uint)(SUB321(auVar30 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar30[0x1f] >> 7) << 0x1f);
    lVar22 = lVar22 + 0x20;
  } while (lVar22 != 0);
  lVar22 = 0x20;
  lVar28 = 0xc80;
  iVar27 = 0;
  iVar20 = 0;
  do {
    auVar30 = *(undefined1 (*) [32])
               ((long)(anonymous_namespace)::History::V
                      [(1000000000 - (ushort)uVar3) %
                       ((int)local_1a10._M_t._M_impl.super__Rb_tree_header._M_node_count -
                       (uint)(ushort)uVar3) + (uint)(ushort)uVar3].pad0 + lVar22);
    lVar22 = lVar22 + 0x20;
    auVar29 = vpsllq_avx2(auVar30,3);
    auVar30 = vpsllq_avx2(auVar30,7);
    iVar20 = iVar20 + POPCOUNT((uint)(SUB321(auVar29 >> 7,0) & 1) |
                               (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1 |
                               (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                               (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                               (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                               (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                               (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                               (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                               (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                               (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                               (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                               (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                               (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                               (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                               (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                               (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                               (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                               (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                               (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                               (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                               (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                               (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                               (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                               (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                               (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                               (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                               (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                               (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                               (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                               (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                               (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f);
    iVar27 = iVar27 + POPCOUNT((uint)(SUB321(auVar30 >> 7,0) & 1) |
                               (uint)(SUB321(auVar30 >> 0xf,0) & 1) << 1 |
                               (uint)(SUB321(auVar30 >> 0x17,0) & 1) << 2 |
                               (uint)(SUB321(auVar30 >> 0x1f,0) & 1) << 3 |
                               (uint)(SUB321(auVar30 >> 0x27,0) & 1) << 4 |
                               (uint)(SUB321(auVar30 >> 0x2f,0) & 1) << 5 |
                               (uint)(SUB321(auVar30 >> 0x37,0) & 1) << 6 |
                               (uint)(SUB321(auVar30 >> 0x3f,0) & 1) << 7 |
                               (uint)(SUB321(auVar30 >> 0x47,0) & 1) << 8 |
                               (uint)(SUB321(auVar30 >> 0x4f,0) & 1) << 9 |
                               (uint)(SUB321(auVar30 >> 0x57,0) & 1) << 10 |
                               (uint)(SUB321(auVar30 >> 0x5f,0) & 1) << 0xb |
                               (uint)(SUB321(auVar30 >> 0x67,0) & 1) << 0xc |
                               (uint)(SUB321(auVar30 >> 0x6f,0) & 1) << 0xd |
                               (uint)(SUB321(auVar30 >> 0x77,0) & 1) << 0xe |
                               (uint)SUB321(auVar30 >> 0x7f,0) << 0xf |
                               (uint)(SUB321(auVar30 >> 0x87,0) & 1) << 0x10 |
                               (uint)(SUB321(auVar30 >> 0x8f,0) & 1) << 0x11 |
                               (uint)(SUB321(auVar30 >> 0x97,0) & 1) << 0x12 |
                               (uint)(SUB321(auVar30 >> 0x9f,0) & 1) << 0x13 |
                               (uint)(SUB321(auVar30 >> 0xa7,0) & 1) << 0x14 |
                               (uint)(SUB321(auVar30 >> 0xaf,0) & 1) << 0x15 |
                               (uint)(SUB321(auVar30 >> 0xb7,0) & 1) << 0x16 |
                               (uint)SUB321(auVar30 >> 0xbf,0) << 0x17 |
                               (uint)(SUB321(auVar30 >> 199,0) & 1) << 0x18 |
                               (uint)(SUB321(auVar30 >> 0xcf,0) & 1) << 0x19 |
                               (uint)(SUB321(auVar30 >> 0xd7,0) & 1) << 0x1a |
                               (uint)(SUB321(auVar30 >> 0xdf,0) & 1) << 0x1b |
                               (uint)(SUB321(auVar30 >> 0xe7,0) & 1) << 0x1c |
                               (uint)(SUB321(auVar30 >> 0xef,0) & 1) << 0x1d |
                               (uint)(SUB321(auVar30 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar30[0x1f] >> 7) << 0x1f);
    lVar28 = lVar28 + -0x20;
  } while (lVar28 != 0);
  __x_00 = (_Link_type)(ulong)(uint)(iVar24 * iVar18);
  printf("Day 18 Part 1: %u\nDay 18 Part 2: %u\n",__x_00,(ulong)(uint)(iVar20 * iVar27));
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>
  ::_M_erase((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>
              *)local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x_00);
  return;
}

Assistant:

void day18(input_t input) {
	std::set<uint16_t, History> seen;
	History::V.reserve(1000);
	History::V.emplace_back(input.s);
	seen.insert(0);

	uint32_t idx = 0;
	for (;;) {
		History::V.push_back(History::V.back().advance());
		auto result = seen.insert(seen.size());
		if (!result.second) {
			uint32_t base = *result.first, loop = seen.size() - base;
			idx = base + (1000000000 - base) % loop;
			break;
		}
	}

	printf("Day 18 Part 1: %u\nDay 18 Part 2: %u\n", History::V[10].value(), History::V[idx].value());
}